

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  char *expr;
  int iVar2;
  lys_node *node_00;
  uint8_t *puVar3;
  lys_module *plVar4;
  byte bVar5;
  undefined8 uVar6;
  char *unaff_R13;
  long lVar7;
  undefined1 auStack_88 [8];
  lyxp_set set;
  
  node_00 = node->schema;
  ctx = node_00->module->ctx;
  set.ht = (hash_table *)0x0;
  set.ctx_pos = 0;
  set.ctx_size = 0;
  set.val._8_8_ = 0;
  set.used = 0;
  set.size = 0;
  set._8_8_ = 0;
  set.val.nodes = (lyxp_set_node *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  set.type = LYXP_SET_EMPTY;
  set._4_4_ = 0;
  if (inout_parent != 0) {
    do {
      node_00 = lys_parent(node_00);
      if (node_00 == (lys_node *)0x0) goto LAB_0011c7e7;
    } while ((node_00->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if ((node_00->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
LAB_0011c7e7:
      uVar6 = 0x1854;
    }
    else {
      node = node->parent;
      if ((node->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        bVar5 = node_00->padding[1];
        unaff_R13 = node_00[1].name;
        goto LAB_0011c84c;
      }
      uVar6 = 0x185d;
    }
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
           ,uVar6);
    return -1;
  }
  LVar1 = node_00->nodetype;
  bVar5 = 0;
  if ((int)LVar1 < 0x10) {
    if (LVar1 != LYS_CONTAINER) {
      if ((LVar1 != LYS_LEAF) && (LVar1 != LYS_LEAFLIST)) goto LAB_0011c84c;
      goto LAB_0011c836;
    }
LAB_0011c83c:
    puVar3 = node_00->padding + 1;
  }
  else {
    if ((int)LVar1 < 0x80) {
      if (LVar1 == LYS_LIST) {
        puVar3 = node_00->padding;
        goto LAB_0011c846;
      }
      if (LVar1 != LYS_ANYXML) goto LAB_0011c84c;
    }
    else {
      if (LVar1 == LYS_NOTIF) goto LAB_0011c83c;
      if (LVar1 != LYS_ANYDATA) goto LAB_0011c84c;
    }
LAB_0011c836:
    puVar3 = node_00->padding + 3;
  }
LAB_0011c846:
  bVar5 = *puVar3;
  unaff_R13 = node_00[1].dsc;
LAB_0011c84c:
  if (bVar5 != 0) {
    set._56_8_ = (ulong)bVar5 * 0x38;
    lVar7 = 0;
    do {
      expr = *(char **)(unaff_R13 + lVar7);
      plVar4 = lyd_node_module(node);
      iVar2 = lyxp_eval(expr,node,LYXP_NODE_ELEM,plVar4,(lyxp_set *)auStack_88,1);
      if (iVar2 != 0) {
        return -1;
      }
      plVar4 = lyd_node_module(node);
      lyxp_set_cast((lyxp_set *)auStack_88,LYXP_SET_BOOLEAN,node,plVar4,1);
      if (set._8_4_ == 0) {
        if ((ignore_fail != 1) &&
           ((ignore_fail != 2 || ((*(ushort *)(unaff_R13 + lVar7 + 0x32) & 0x600) == 0)))) {
          ly_vlog(ctx,LYE_NOMUST,LY_VLOG_LYD,node,*(undefined8 *)(unaff_R13 + lVar7));
          if (*(char **)(unaff_R13 + lVar7 + 0x20) != (char *)0x0) {
            ly_vlog_str(ctx,LY_VLOG_PREV,*(char **)(unaff_R13 + lVar7 + 0x20));
          }
          if (*(char **)(unaff_R13 + lVar7 + 0x18) != (char *)0x0) {
            ly_err_last_set_apptag(ctx,*(char **)(unaff_R13 + lVar7 + 0x18));
            return 1;
          }
          return 1;
        }
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
               "Must condition \"%s\" not satisfied, but it is not required.",
               *(undefined8 *)(unaff_R13 + lVar7));
      }
      lVar7 = lVar7 + 0x38;
    } while (set._56_8_ != lVar7);
  }
  return 0;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;
    struct ly_ctx *ctx = node->schema->module->ctx;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT(ctx);
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT(ctx);
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((must[i].flags & (LYS_XPCONF_DEP | LYS_XPSTATE_DEP)) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(ctx, LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    ly_vlog_str(ctx, LY_VLOG_PREV, must[i].emsg);
                }
                if (must[i].eapptag) {
                    ly_err_last_set_apptag(ctx, must[i].eapptag);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}